

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O3

void Diligent::BasicFileSystem::CorrectSlashes(String *Path,Char Slash)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  char cVar4;
  int iVar5;
  undefined7 in_register_00000031;
  string msg;
  string local_40;
  
  cVar4 = '\\';
  iVar5 = (int)CONCAT71(in_register_00000031,Slash);
  if ((iVar5 == 0) || (iVar5 == 0x2f)) {
    Slash = '/';
  }
  else {
    if (iVar5 != 0x5c) {
      FormatString<char[23]>(&local_40,(char (*) [23])"Incorrect slash symbol");
      DebugAssertionFailed
                (local_40._M_dataplus._M_p,"CorrectSlashes",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/BasicFileSystem.cpp"
                 ,99);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if (Slash != '\\') goto LAB_0071b082;
    }
    cVar4 = '/';
    Slash = '\\';
  }
LAB_0071b082:
  sVar1 = Path->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (Path->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      if (pcVar2[sVar3] == cVar4) {
        pcVar2[sVar3] = Slash;
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return;
}

Assistant:

void BasicFileSystem::CorrectSlashes(String& Path, Char Slash)
{
    if (Slash != 0)
        DEV_CHECK_ERR(IsSlash(Slash), "Incorrect slash symbol");
    else
        Slash = SlashSymbol;
    Char RevSlashSym = (Slash == '\\') ? '/' : '\\';
    std::replace(Path.begin(), Path.end(), RevSlashSym, Slash);
}